

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BasicTexImage3DCase::createTexture(BasicTexImage3DCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 dVar3;
  byte bVar4;
  int width;
  int height;
  int level;
  int ndx;
  long lVar5;
  int depth;
  float fVar6;
  deUint32 tex;
  ContextWrapper *local_d0;
  ulong local_c8;
  TransferFormat local_c0;
  Vec4 gMax;
  Vec4 gMin;
  TextureLevel levelData;
  Random rnd;
  PixelBufferAccess local_58;
  
  tex = 0;
  dVar3 = deStringHash((this->super_Texture3DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  local_c0 = glu::getTransferFormat((this->super_Texture3DSpecCase).m_texFormat);
  local_c8 = (ulong)local_c0 >> 0x20;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(local_c0.format,local_c0.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  this_00 = &(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x806f,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_d0 = this_00;
  if (0 < (this->super_Texture3DSpecCase).m_numLevels) {
    level = 0;
    do {
      bVar4 = (byte)level;
      width = (this->super_Texture3DSpecCase).m_width >> (bVar4 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = (this->super_Texture3DSpecCase).m_height >> (bVar4 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      depth = (this->super_Texture3DSpecCase).m_depth >> (bVar4 & 0x1f);
      if (depth < 2) {
        depth = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar5 = 0;
      do {
        fVar1 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[lVar5];
        fVar2 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[lVar5];
        fVar6 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar5] = (fVar2 - fVar1) * fVar6 + fVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar5 = 0;
      do {
        fVar1 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMin.m_data[lVar5];
        fVar2 = (this->super_Texture3DSpecCase).m_texFormatInfo.valueMax.m_data[lVar5];
        fVar6 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar5] = (fVar2 - fVar1) * fVar6 + fVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      tcu::TextureLevel::setSize(&levelData,width,height,depth);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      dVar3 = this->m_internalFormat;
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      sglr::ContextWrapper::glTexImage3D
                (local_d0,0x806f,level,dVar3,width,height,depth,0,local_c0.format,(deUint32)local_c8
                 ,local_58.super_ConstPixelBufferAccess.m_data);
      level = level + 1;
    } while (level < (this->super_Texture3DSpecCase).m_numLevels);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32				tex			= 0;
		de::Random				rnd			(deStringHash(getName()));
		glu::TransferFormat		transferFmt	= glu::getTransferFormat(m_texFormat);
		tcu::TextureLevel		levelData	(glu::mapGLTransferFormat(transferFmt.format, transferFmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_3D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width	>> ndx);
			int		levelH		= de::max(1, m_height	>> ndx);
			int		levelD		= de::max(1, m_depth	>> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelH, levelD);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_3D, ndx, m_internalFormat, levelW, levelH, levelD, 0, transferFmt.format, transferFmt.dataType, levelData.getAccess().getDataPtr());
		}
	}